

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *masks,bool return_success,
          StringPiece has_bits_var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  pointer pcVar1;
  char *pcVar2;
  AlphaNum *pAVar3;
  LogMessage *other;
  string *extraout_RAX;
  undefined7 in_register_00000009;
  AlphaNum *b;
  ulong uVar4;
  AlphaNum *pAVar5;
  AlphaNum *c;
  Hex hex;
  AlphaNum *in_stack_fffffffffffffd98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  char *local_228;
  char *local_220;
  string result;
  string m;
  string local_1a0;
  AlphaNum local_180;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pAVar5 = (AlphaNum *)has_bits_var.ptr_;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar3 = *(AlphaNum **)this;
  b = *(AlphaNum **)(this + 8);
  c = pAVar5;
  if (b != pAVar3) {
    buffer = &result.field_2;
    uVar4 = 0;
    do {
      hex.value = (ulong)*(uint *)(pAVar3->digits + uVar4 * 4 + -0x10);
      if (hex.value != 0) {
        local_228 = "0x";
        local_220 = (char *)0x2;
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum(&local_150,hex);
        StrCat_abi_cxx11_(&m,(protobuf *)&local_228,&local_150,b);
        local_228 = "((";
        local_220 = (char *)0x2;
        local_120.piece_data_ = "[";
        local_120.piece_size_ = 1;
        result._M_dataplus._M_p = (pointer)buffer;
        local_150.piece_data_ = (char *)CONCAT71(in_register_00000009,return_success);
        local_150.piece_size_ = (size_t)pAVar5;
        pcVar2 = FastInt32ToBufferLeft((int32)uVar4,buffer->_M_local_buf);
        result._M_string_length = (long)pcVar2 - (long)buffer;
        local_180.piece_data_ = "] & ";
        local_180.piece_size_ = 4;
        local_60.piece_data_ = m._M_dataplus._M_p;
        local_60.piece_size_ = m._M_string_length;
        local_90.piece_data_ = ") ^ ";
        local_90.piece_size_ = 4;
        local_c0.piece_data_ = m._M_dataplus._M_p;
        local_c0.piece_size_ = m._M_string_length;
        local_f0.piece_data_ = ")";
        local_f0.piece_size_ = 1;
        c = (AlphaNum *)&result;
        StrCat_abi_cxx11_(&local_1a0,(protobuf *)&local_228,&local_150,&local_120,c,&local_180,
                          &local_60,&local_90,&local_c0,&local_f0,in_stack_fffffffffffffd98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                   &local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)m._M_dataplus._M_p != &m.field_2) {
          operator_delete(m._M_dataplus._M_p);
        }
        pAVar3 = *(AlphaNum **)this;
        b = *(AlphaNum **)(this + 8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)b - (long)pAVar3 >> 2));
    if (parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002a47ec;
  }
  internal::LogMessage::LogMessage
            ((LogMessage *)&local_228,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
             ,0x60);
  other = internal::LogMessage::operator<<
                    ((LogMessage *)&local_228,"CHECK failed: !parts.empty(): ");
  internal::LogFinisher::operator=((LogFinisher *)&local_150,other);
  internal::LogMessage::~LogMessage((LogMessage *)&local_228);
LAB_002a47ec:
  if ((char *)((long)parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) == (char *)0x20) {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    pcVar1 = ((parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&result,pcVar1,
               pcVar1 + (parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  }
  else {
    local_228 = "(";
    local_220 = (char *)0x1;
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&local_180,(protobuf *)&parts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"\n       | ",
               (char *)((long)parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)parts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start));
    local_150.piece_data_ = local_180.piece_data_;
    local_150.piece_size_ = local_180.piece_size_;
    local_120.piece_data_ = ")";
    local_120.piece_size_ = 1;
    StrCat_abi_cxx11_(&result,(protobuf *)&local_228,&local_150,&local_120,c);
    if (local_180.piece_data_ != local_180.digits) {
      operator_delete(local_180.piece_data_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,result._M_dataplus._M_p,
             result._M_dataplus._M_p + result._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  return extraout_RAX;
}

Assistant:

std::string ConditionalToCheckBitmasks(
    const std::vector<uint32_t>& masks, bool return_success = true,
    StringPiece has_bits_var = "_has_bits_") {
  std::vector<std::string> parts;
  for (int i = 0; i < masks.size(); i++) {
    if (masks[i] == 0) continue;
    std::string m = StrCat("0x", strings::Hex(masks[i], strings::ZERO_PAD_8));
    // Each xor evaluates to 0 if the expected bits are present.
    parts.push_back(
        StrCat("((", has_bits_var, "[", i, "] & ", m, ") ^ ", m, ")"));
  }
  GOOGLE_CHECK(!parts.empty());
  // If we have multiple parts, each expected to be 0, then bitwise-or them.
  std::string result =
      parts.size() == 1
          ? parts[0]
          : StrCat("(", Join(parts, "\n       | "), ")");
  return result + (return_success ? " == 0" : " != 0");
}